

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::addAttachments(QPDFJob *this,QPDF *pdf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int **pp_Var4;
  pointer pbVar5;
  QPDFEFStreamObjectHelper *this_00;
  long *plVar6;
  runtime_error *this_01;
  size_type *psVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  iterator __end2;
  iterator __begin2;
  pointer pbVar9;
  QPDFFileSpecObjectHelper fs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  duplicated_keys;
  QPDFEFStreamObjectHelper efs;
  QPDFEmbeddedFileDocumentHelper efdh;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  QPDF *local_160;
  QPDFJob *local_158;
  QPDFFileSpecObjectHelper local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  undefined1 local_98 [16];
  QPDFEFStreamObjectHelper local_88;
  string local_50;
  
  p_Var1 = &local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_158 = this;
  local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"/UseAttachments","");
  maybe_set_pagemode(pdf,(string *)&local_150);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
    operator_delete(local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    CONCAT71(local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._1_7_,
                             local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi._0_1_) + 1);
  }
  local_160 = pdf;
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)&local_50,pdf);
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar2 = (local_158->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar6 = *(long **)&(peVar2->attachments_to_add).
                      super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>
                      ._M_impl._M_node.super__List_node_base;
  local_e0 = &peVar2->attachments_to_add;
  if ((list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *)plVar6 != local_e0) {
    do {
      if ((char)plVar6[0x1e] == '\0') {
        QPDFEmbeddedFileDocumentHelper::getEmbeddedFile
                  ((QPDFEmbeddedFileDocumentHelper *)&local_150,&local_50);
        pp_Var4 = local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
        if (local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pp_Var4 ==
            (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00183345;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_118,(value_type *)(plVar6 + 6));
      }
      else {
LAB_00183345:
        QPDFFileSpecObjectHelper::createFileSpec
                  (&local_150,local_160,(string *)(plVar6 + 10),(string *)(plVar6 + 2));
        if (plVar6[0x1b] != 0) {
          QPDFFileSpecObjectHelper::setDescription(&local_150,(string *)(plVar6 + 0x1a));
        }
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
        QPDFFileSpecObjectHelper::getEmbeddedFileStream
                  ((QPDFFileSpecObjectHelper *)local_98,(string *)&local_150);
        QPDFEFStreamObjectHelper::QPDFEFStreamObjectHelper
                  ((QPDFEFStreamObjectHelper *)(local_98 + 0x10),(QPDFObjectHandle *)local_98);
        if ((element_type *)local_98._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        this_00 = QPDFEFStreamObjectHelper::setCreationDate
                            ((QPDFEFStreamObjectHelper *)(local_98 + 0x10),(string *)(plVar6 + 0xe))
        ;
        QPDFEFStreamObjectHelper::setModDate(this_00,(string *)(plVar6 + 0x12));
        if (plVar6[0x17] != 0) {
          QPDFEFStreamObjectHelper::setSubtype
                    ((QPDFEFStreamObjectHelper *)(local_98 + 0x10),(string *)(plVar6 + 0x16));
        }
        QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile
                  ((QPDFEmbeddedFileDocumentHelper *)&local_50,(string *)(plVar6 + 6),&local_150);
        local_100._8_8_ = 0;
        local_e8 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2111:21)>
                   ::_M_invoke;
        local_f0 = std::
                   _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2111:21)>
                   ::_M_manager;
        local_100._M_unused._M_object = (string *)(plVar6 + 2);
        doIfVerbose(local_158,
                    (function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                     *)&local_100);
        if (local_f0 != (code *)0x0) {
          (*local_f0)(&local_100,&local_100,__destroy_functor);
        }
        QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper
                  ((QPDFEFStreamObjectHelper *)(local_98 + 0x10));
        QPDFFileSpecObjectHelper::~QPDFFileSpecObjectHelper(&local_150);
      }
      pbVar5 = local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      plVar6 = (long *)*plVar6;
    } while ((list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *)plVar6 !=
             local_e0);
    if (local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_118.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_150.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
           (_func_int **)
           &local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ = 0;
      pbVar9 = local_118.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (local_150.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
           ) {
          std::__cxx11::string::append((char *)&local_150);
        }
        std::__cxx11::string::_M_append((char *)&local_150,(ulong)(pbVar9->_M_dataplus)._M_p);
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != pbVar5);
      QPDF::getFilename_abi_cxx11_(&local_b8,local_160);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
      local_d8._M_dataplus._M_p = (pointer)*plVar6;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_d8._M_dataplus._M_p == psVar7) {
        local_d8.field_2._M_allocated_capacity = *psVar7;
        local_d8.field_2._8_8_ = plVar6[3];
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar7;
      }
      local_d8._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::operator+(&local_180,&local_d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150
                    );
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_180);
      p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_88.super_QPDFObjectHelper.super_BaseHandle.obj + 8);
      local_88.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)*plVar6;
      p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar6 + 2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_88.super_QPDFObjectHelper._vptr_QPDFObjectHelper == p_Var8) {
        local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8->_vptr__Sp_counted_base;
        local_88.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)plVar6[3];
        local_88.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var3;
      }
      else {
        local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var8->_vptr__Sp_counted_base;
      }
      local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)plVar6[1];
      *plVar6 = (long)p_Var8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_150,(string *)(local_98 + 0x10));
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_88.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var3) {
        operator_delete(local_88.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                        (ulong)((long)&(local_88.super_QPDFObjectHelper.super_BaseHandle.obj.
                                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&local_150);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118);
  QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)&local_50);
  return;
}

Assistant:

void
QPDFJob::addAttachments(QPDF& pdf)
{
    maybe_set_pagemode(pdf, "/UseAttachments");
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    std::vector<std::string> duplicated_keys;
    for (auto const& to_add: m->attachments_to_add) {
        if ((!to_add.replace) && efdh.getEmbeddedFile(to_add.key)) {
            duplicated_keys.push_back(to_add.key);
            continue;
        }

        auto fs = QPDFFileSpecObjectHelper::createFileSpec(pdf, to_add.filename, to_add.path);
        if (!to_add.description.empty()) {
            fs.setDescription(to_add.description);
        }
        auto efs = QPDFEFStreamObjectHelper(fs.getEmbeddedFileStream());
        efs.setCreationDate(to_add.creationdate).setModDate(to_add.moddate);
        if (!to_add.mimetype.empty()) {
            efs.setSubtype(to_add.mimetype);
        }

        efdh.replaceEmbeddedFile(to_add.key, fs);
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": attached " << to_add.path << " as " << to_add.filename << " with key "
              << to_add.key << "\n";
        });
    }

    if (!duplicated_keys.empty()) {
        std::string message;
        for (auto const& k: duplicated_keys) {
            if (!message.empty()) {
                message += ", ";
            }
            message += k;
        }
        message = pdf.getFilename() +
            " already has attachments with the following keys: " + message +
            "; use --replace to replace or --key to specify a different key";
        throw std::runtime_error(message);
    }
}